

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

bool __thiscall Assembler::isInstruction(Assembler *this,string *line)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (line->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + line->_M_string_length);
  bVar2 = checkIfNoOperand(this,&local_50);
  bVar3 = true;
  if (!bVar2) {
    pcVar1 = (line->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + line->_M_string_length);
    bVar2 = checkIfLdStr(this,&local_70);
    bVar3 = true;
    if (!bVar2) {
      pcVar1 = (line->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + line->_M_string_length);
      bVar2 = checkIfJump(this,&local_90);
      bVar3 = true;
      if (!bVar2) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        pcVar1 = (line->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar1,pcVar1 + line->_M_string_length);
        bVar2 = checkIfInstrWithTwoReg(this,&local_b0);
        bVar3 = true;
        if (!bVar2) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          pcVar1 = (line->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,pcVar1,pcVar1 + line->_M_string_length);
          bVar3 = checkIfOneOpReg(this,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar3 != false) {
    this->isLabelWithoutCode = false;
  }
  return bVar3;
}

Assistant:

bool Assembler::isInstruction(string line) {
    if (checkIfNoOperand(line) || checkIfLdStr(line) ||
        checkIfJump(line) || checkIfInstrWithTwoReg(line) || checkIfOneOpReg(line)) {
        isLabelWithoutCode = false;
        return true;
    } else return false;
}